

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::updateGeometries(QAbstractItemView *this)

{
  QAbstractItemViewPrivate *this_00;
  QObject *in_RDI;
  QBasicTimer *unaff_retaddr;
  QAbstractItemViewPrivate *d;
  int in_stack_0000001c;
  QObject *obj;
  
  obj = in_RDI;
  this_00 = d_func((QAbstractItemView *)0x80ac2b);
  (**(code **)(*(long *)in_RDI + 0x260))();
  QBasicTimer::start(unaff_retaddr,in_stack_0000001c,obj);
  QAbstractItemViewPrivate::updateGeometry(this_00);
  return;
}

Assistant:

void QAbstractItemView::updateGeometries()
{
    Q_D(QAbstractItemView);
    updateEditorGeometries();
    d->fetchMoreTimer.start(0, this); //fetch more later
    d->updateGeometry();
}